

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_msl_add_shader_output(spvc_compiler compiler,spvc_msl_shader_interface_var *so)

{
  spvc_context_s *this;
  undefined1 local_78 [8];
  MSLShaderInterfaceVariable output;
  CompilerMSL *msl;
  allocator local_41;
  string local_40;
  spvc_msl_shader_interface_var *local_20;
  spvc_msl_shader_interface_var *so_local;
  spvc_compiler compiler_local;
  
  local_20 = so;
  so_local = (spvc_msl_shader_interface_var *)compiler;
  if (compiler->backend == SPVC_BACKEND_MSL) {
    output._16_8_ =
         std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::get
                   (&compiler->compiler);
    spirv_cross::MSLShaderInterfaceVariable::MSLShaderInterfaceVariable
              ((MSLShaderInterfaceVariable *)local_78);
    local_78._0_4_ = local_20->location;
    output.location = local_20->format;
    output.component = local_20->builtin;
    output.format = local_20->vecsize;
    spirv_cross::CompilerMSL::add_msl_shader_output
              ((CompilerMSL *)output._16_8_,(MSLShaderInterfaceVariable *)local_78);
    compiler_local._4_4_ = SPVC_SUCCESS;
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"MSL function used on a non-MSL backend.",&local_41);
    spvc_context_s::report_error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    compiler_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_msl_add_shader_output(spvc_compiler compiler, const spvc_msl_shader_interface_var *so)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	MSLShaderInterfaceVariable output;
	output.location = so->location;
	output.format = static_cast<MSLShaderVariableFormat>(so->format);
	output.builtin = static_cast<spv::BuiltIn>(so->builtin);
	output.vecsize = so->vecsize;
	msl.add_msl_shader_output(output);
	return SPVC_SUCCESS;
#else
	(void)so;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}